

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu3_print.h
# Opt level: O0

int grisu3_print_double(double v,char *dst)

{
  int iVar1;
  int local_58;
  int local_54;
  int local_50;
  char *local_48;
  char *s2;
  uint64_t u64;
  int i;
  int decimals;
  int success;
  int len;
  int d_exp;
  char *dst_local;
  double v_local;
  
  _len = dst;
  dst_local = (char *)v;
  s2 = (char *)grisu3_cast_uint64_from_double(v);
  local_48 = _len;
  if (_len == (char *)0x0) {
    __assert_fail("dst",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/include/flatcc/portable/grisu3_print.h"
                  ,0xd0,"int grisu3_print_double(double, char *)");
  }
  if ((ulong)((long)s2 * 2) < 0xffe0000000000001) {
    if (((ulong)s2 & 0x8000000000000000) != 0) {
      local_48 = _len + 1;
      *_len = '-';
      dst_local = (char *)((ulong)dst_local ^ 0x8000000000000000);
      s2 = (char *)((ulong)s2 ^ 0x8000000000000000);
    }
    if (s2 == (char *)0x0) {
      *local_48 = '0';
      local_48[1] = '\0';
      v_local._4_4_ = (int)(local_48 + 1) - (int)_len;
    }
    else if (s2 == (char *)0x7ff0000000000000) {
      builtin_strncpy(local_48,"inf",4);
      v_local._4_4_ = (int)(local_48 + 3) - (int)_len;
    }
    else {
      iVar1 = grisu3((double)dst_local,local_48,&decimals,&success);
      if (iVar1 == 0) {
        iVar1 = sprintf(local_48,"%.17g",dst_local);
        v_local._4_4_ = iVar1 + ((int)local_48 - (int)_len);
      }
      else {
        if (decimals + -1 < 2) {
          local_50 = 1;
        }
        else {
          local_50 = decimals + -1;
        }
        if (local_50 < -success) {
          if (decimals + -1 < 2) {
            local_58 = 1;
          }
          else {
            local_58 = decimals + -1;
          }
          local_54 = local_58;
        }
        else {
          local_54 = -success;
        }
        if (((success < 0) && (-3 < decimals + success)) &&
           (decimals == -success || SBORROW4(decimals,-success) != decimals + success < 0)) {
          memmove(local_48 + ((2 - (long)success) - (long)decimals),local_48,(long)decimals);
          *local_48 = '0';
          local_48[1] = '.';
          for (u64._4_4_ = 2; u64._4_4_ < (2 - success) - decimals; u64._4_4_ = u64._4_4_ + 1) {
            local_48[u64._4_4_] = '0';
          }
          iVar1 = u64._4_4_ + decimals;
        }
        else if ((success < 0) && (1 < decimals)) {
          for (u64._4_4_ = 0; u64._4_4_ < local_54; u64._4_4_ = u64._4_4_ + 1) {
            local_48[decimals - u64._4_4_] = local_48[(decimals - u64._4_4_) + -1];
          }
          iVar1 = decimals + 1;
          local_48[decimals - local_54] = '.';
          success = local_54 + success;
          if (success != 0) {
            decimals = decimals + 2;
            local_48[iVar1] = 'e';
            iVar1 = grisu3_i_to_str(success,local_48 + decimals);
            iVar1 = iVar1 + decimals;
          }
        }
        else if ((success < 0) || (2 < success)) {
          iVar1 = decimals + 1;
          local_48[decimals] = 'e';
          decimals = iVar1;
          iVar1 = grisu3_i_to_str(success,local_48 + iVar1);
          iVar1 = iVar1 + decimals;
        }
        else {
          iVar1 = decimals;
          if (0 < success) {
            while (iVar1 = decimals, 0 < success) {
              local_48[decimals] = '0';
              decimals = decimals + 1;
              success = success + -1;
            }
          }
        }
        decimals = iVar1;
        local_48[decimals] = '\0';
        v_local._4_4_ = ((int)local_48 + decimals) - (int)_len;
      }
    }
  }
  else {
    v_local._4_4_ = grisu3_print_nan((uint64_t)s2,_len);
  }
  return v_local._4_4_;
}

Assistant:

static int grisu3_print_double(double v, char *dst)
{
    int d_exp, len, success, decimals, i;
    uint64_t u64 = grisu3_cast_uint64_from_double(v);
    char *s2 = dst;
    assert(dst);

    /* Prehandle NaNs */
    if ((u64 << 1) > 0xFFE0000000000000ULL) return grisu3_print_nan(u64, dst);
    /* Prehandle negative values. */
    if ((u64 & GRISU3_D64_SIGN) != 0) { *s2++ = '-'; v = -v; u64 ^= GRISU3_D64_SIGN; }
    /* Prehandle zero. */
    if (!u64) { *s2++ = '0'; *s2 = '\0'; return (int)(s2 - dst); }
    /* Prehandle infinity. */
    if (u64 == GRISU3_D64_EXP_MASK) { *s2++ = 'i'; *s2++ = 'n'; *s2++ = 'f'; *s2 = '\0'; return (int)(s2 - dst); }

    success = grisu3(v, s2, &len, &d_exp);
    /* If grisu3 was not able to convert the number to a string, then use old sprintf (suboptimal). */
    if (!success) return sprintf(s2, "%.17g", v) + (int)(s2 - dst);

    /* We now have an integer string of form "151324135" and a base-10 exponent for that number. */
    /* Next, decide the best presentation for that string by whether to use a decimal point, or the scientific exponent notation 'e'. */
    /* We don't pick the absolute shortest representation, but pick a balance between readability and shortness, e.g. */
    /* 1.545056189557677e-308 could be represented in a shorter form */
    /* 1545056189557677e-323 but that would be somewhat unreadable. */
    decimals = GRISU3_MIN(-d_exp, GRISU3_MAX(1, len-1));

    /* mikkelfj:
     * fix zero prefix .1 => 0.1, important for JSON export.
     * prefer unscientific notation at same length:
     * -1.2345e-4 over -1.00012345,
     * -1.0012345 over -1.2345e-3
     */
    if (d_exp < 0 && (len + d_exp) > -3 && len <= -d_exp)
    {
        /* mikkelfj: fix zero prefix .1 => 0.1, and short exponents 1.3e-2 => 0.013. */
        memmove(s2 + 2 - d_exp - len, s2, (size_t)len);
        s2[0] = '0';
        s2[1] = '.';
        for (i = 2; i < 2-d_exp-len; ++i) s2[i] = '0';
        len += i;
    }
    else if (d_exp < 0 && len > 1) /* Add decimal point? */
    {
        for(i = 0; i < decimals; ++i) s2[len-i] = s2[len-i-1];
        s2[len++ - decimals] = '.';
        d_exp += decimals;
        /* Need scientific notation as well? */
        if (d_exp != 0) { s2[len++] = 'e'; len += grisu3_i_to_str(d_exp, s2+len); }
    }
    /* Add scientific notation? */
    else if (d_exp < 0 || d_exp > 2) { s2[len++] = 'e'; len += grisu3_i_to_str(d_exp, s2+len); }
    /* Add zeroes instead of scientific notation? */
    else if (d_exp > 0) { while(d_exp-- > 0) s2[len++] = '0'; }
    s2[len] = '\0'; /* grisu3 doesn't null terminate, so ensure termination. */
    return (int)(s2+len-dst);
}